

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

void fdb_doc_set_seqnum(fdb_doc *doc,fdb_seqnum_t seqnum)

{
  if (doc != (fdb_doc *)0x0) {
    doc->seqnum = seqnum;
    doc->flags = (uint)(seqnum != 0xffffffffffffffff) | doc->flags & 0xfffffffe;
  }
  return;
}

Assistant:

LIBFDB_API
void fdb_doc_set_seqnum(fdb_doc *doc,
                        const fdb_seqnum_t seqnum)
{
    if (doc) {
        doc->seqnum = seqnum;
        if (seqnum != SEQNUM_NOT_USED) {
            doc->flags |= FDB_CUSTOM_SEQNUM; // fdb_set will now use above seqnum
        } else { // reset custom seqnum flag, fdb_set will now generate new seqnum
            doc->flags &= ~FDB_CUSTOM_SEQNUM;
        }
    }
}